

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::builtin_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,BuiltIn builtin,StorageClass storage)

{
  uint uVar1;
  bool bVar2;
  ExecutionModel EVar3;
  char *pcVar4;
  SPIREntryPoint *pSVar5;
  CompilerError *this_00;
  undefined4 in_register_0000000c;
  uint *ts_1;
  char *pcVar6;
  allocator local_39;
  string local_38;
  
  ts_1 = &switchD_0029e6bd::switchdataD_0034655c;
  switch(builtin) {
  case BuiltInPosition:
    pcVar6 = "gl_Position";
    break;
  case BuiltInPointSize:
    pcVar6 = "gl_PointSize";
    break;
  case 2:
  case BuiltInSampleMask|BuiltInPointSize:
  case BuiltInWorkDim:
  case BuiltInGlobalSize:
  case BuiltInEnqueuedWorkgroupSize:
  case BuiltInGlobalOffset:
  case BuiltInGlobalLinearId:
  case BuiltInGlobalLinearId|BuiltInPointSize:
  case BuiltInSubgroupMaxSize:
  case BuiltInNumEnqueuedSubgroups:
switchD_0029e693_caseD_1145:
    ::std::__cxx11::to_string(&local_38,builtin);
    join<char_const(&)[12],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)"gl_BuiltIn_",(char (*) [12])&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1);
    ::std::__cxx11::string::~string((string *)&local_38);
    return __return_storage_ptr__;
  case BuiltInClipDistance:
    if ((this->options).es == true) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_clip_cull_distance",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    pcVar6 = "gl_ClipDistance";
    break;
  case BuiltInCullDistance:
    if ((this->options).es == true) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_clip_cull_distance",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    pcVar6 = "gl_CullDistance";
    break;
  case BuiltInVertexId:
    if ((this->options).vulkan_semantics == true) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Cannot implement gl_VertexID in Vulkan GLSL. This shader was created with GL semantics."
                );
      goto LAB_0029f560;
    }
    goto LAB_0029ecf0;
  case BuiltInInstanceId:
    if (((this->options).vulkan_semantics == true) &&
       (pSVar5 = Compiler::get_entry_point(&this->super_Compiler),
       2 < pSVar5->model - ExecutionModelIntersectionKHR)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Cannot implement gl_InstanceID in Vulkan GLSL. This shader was created with GL semantics."
                );
      goto LAB_0029f560;
    }
    if (((this->options).es == false) && ((this->options).version < 0x8c)) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_draw_instanced",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    goto LAB_0029f10c;
  case BuiltInPrimitiveId:
    if ((storage == Input) &&
       (pSVar5 = Compiler::get_entry_point(&this->super_Compiler),
       pSVar5->model == ExecutionModelGeometry)) {
      pcVar6 = "gl_PrimitiveIDIn";
    }
    else {
      pcVar6 = "gl_PrimitiveID";
    }
    break;
  case BuiltInInvocationId:
    pcVar6 = "gl_InvocationID";
    break;
  case BuiltInLayer:
    EVar3 = Compiler::get_execution_model(&this->super_Compiler);
    if ((EVar3 & ~ExecutionModelTessellationEvaluation) == ExecutionModelVertex) {
      if ((this->options).es == true) {
        ::std::__cxx11::string::string((string *)&local_38,"GL_NV_viewport_array2",&local_39);
        require_extension_internal(this,&local_38);
      }
      else {
        ::std::__cxx11::string::string
                  ((string *)&local_38,"GL_ARB_shader_viewport_layer_array",&local_39);
        require_extension_internal(this,&local_38);
      }
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    pcVar6 = "gl_Layer";
    break;
  case BuiltInViewportIndex:
    pcVar6 = "gl_ViewportIndex";
    break;
  case BuiltInTessLevelOuter:
    pcVar6 = "gl_TessLevelOuter";
    break;
  case BuiltInTessLevelInner:
    pcVar6 = "gl_TessLevelInner";
    break;
  case BuiltInTessCoord:
    pcVar6 = "gl_TessCoord";
    break;
  case BuiltInPatchVertices:
    pcVar6 = "gl_PatchVerticesIn";
    break;
  case BuiltInFragCoord:
    pcVar6 = "gl_FragCoord";
    break;
  case BuiltInPointCoord:
    pcVar6 = "gl_PointCoord";
    break;
  case BuiltInFrontFacing:
    pcVar6 = "gl_FrontFacing";
    break;
  case BuiltInSampleId:
    bVar2 = is_legacy(this);
    if (bVar2) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Sample variables not supported in legacy GLSL.");
      goto LAB_0029f560;
    }
    bVar2 = (this->options).es;
    uVar1 = (this->options).version;
    if ((uVar1 < 0x140 & bVar2) == 1) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_OES_sample_variables",&local_39);
      require_extension_internal(this,&local_38);
LAB_0029f1d9:
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    else if (bVar2 == false && uVar1 < 400) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_sample_shading",&local_39);
      require_extension_internal(this,&local_38);
      goto LAB_0029f1d9;
    }
    pcVar6 = "gl_SampleID";
    break;
  case BuiltInSamplePosition:
    bVar2 = is_legacy(this);
    if (bVar2) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Sample variables not supported in legacy GLSL.");
      goto LAB_0029f560;
    }
    bVar2 = (this->options).es;
    uVar1 = (this->options).version;
    if ((uVar1 < 0x140 & bVar2) == 1) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_OES_sample_variables",&local_39);
      require_extension_internal(this,&local_38);
LAB_0029f148:
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    else if (bVar2 == false && uVar1 < 400) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_sample_shading",&local_39);
      require_extension_internal(this,&local_38);
      goto LAB_0029f148;
    }
    pcVar6 = "gl_SamplePosition";
    break;
  case BuiltInSampleMask:
    bVar2 = is_legacy(this);
    if (bVar2) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Sample variables not supported in legacy GLSL.");
      goto LAB_0029f560;
    }
    bVar2 = (this->options).es;
    uVar1 = (this->options).version;
    if ((uVar1 < 0x140 & bVar2) == 1) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_OES_sample_variables",&local_39);
      require_extension_internal(this,&local_38);
LAB_0029f18e:
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    else if (bVar2 == false && uVar1 < 400) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_sample_shading",&local_39);
      require_extension_internal(this,&local_38);
      goto LAB_0029f18e;
    }
    if (storage == Input) {
      pcVar6 = "gl_SampleMaskIn";
    }
    else {
      pcVar6 = "gl_SampleMask";
    }
    break;
  case BuiltInFragDepth:
    pcVar6 = "gl_FragDepth";
    break;
  case BuiltInHelperInvocation:
    pcVar6 = "gl_HelperInvocation";
    break;
  case BuiltInNumWorkgroups:
    pcVar6 = "gl_NumWorkGroups";
    break;
  case BuiltInWorkgroupSize:
    pcVar6 = "gl_WorkGroupSize";
    break;
  case BuiltInWorkgroupId:
    pcVar6 = "gl_WorkGroupID";
    break;
  case BuiltInLocalInvocationId:
    pcVar6 = "gl_LocalInvocationID";
    break;
  case BuiltInGlobalInvocationId:
    pcVar6 = "gl_GlobalInvocationID";
    break;
  case BuiltInLocalInvocationIndex:
    pcVar6 = "gl_LocalInvocationIndex";
    break;
  case BuiltInSubgroupSize:
    request_subgroup_feature(this,SubgroupSize);
    pcVar6 = "gl_SubgroupSize";
    break;
  case BuiltInNumSubgroups:
    request_subgroup_feature(this,NumSubgroups);
    pcVar6 = "gl_NumSubgroups";
    break;
  case BuiltInSubgroupId:
    request_subgroup_feature(this,SubgroupID);
    pcVar6 = "gl_SubgroupID";
    break;
  case BuiltInSubgroupLocalInvocationId:
    request_subgroup_feature(this,SubgroupInvocationID);
    pcVar6 = "gl_SubgroupInvocationID";
    break;
  case BuiltInVertexIndex:
    if ((this->options).vulkan_semantics == true) {
      pcVar6 = "gl_VertexIndex";
      break;
    }
LAB_0029ecf0:
    pcVar6 = "gl_VertexID";
    break;
  case BuiltInInstanceIndex:
    if ((this->options).vulkan_semantics == true) {
      pcVar6 = "gl_InstanceIndex";
      break;
    }
    if (((this->options).es == false) && ((this->options).version < 0x8c)) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_ARB_draw_instanced",&local_39);
      require_extension_internal(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    if ((this->options).vertex.support_nonzero_base_instance == true) {
      if ((this->options).vulkan_semantics == false) {
        ::std::__cxx11::string::string
                  ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
      }
      pcVar6 = "(gl_InstanceID + SPIRV_Cross_BaseInstance)";
      break;
    }
LAB_0029f10c:
    pcVar6 = "gl_InstanceID";
    break;
  default:
    ts_1 = &switchD_0029e6d9::switchdataD_003466b8;
    switch(builtin) {
    case BuiltInLaunchIdKHR:
      pcVar4 = "gl_LaunchIDEXT";
      pcVar6 = "gl_LaunchIDNV";
      break;
    case BuiltInLaunchSizeKHR:
      pcVar4 = "gl_LaunchSizeEXT";
      pcVar6 = "gl_LaunchSizeNV";
      break;
    case BuiltInWorldRayOriginKHR:
      pcVar4 = "gl_WorldRayOriginEXT";
      pcVar6 = "gl_WorldRayOriginNV";
      break;
    case BuiltInWorldRayDirectionKHR:
      pcVar4 = "gl_WorldRayDirectionEXT";
      pcVar6 = "gl_WorldRayDirectionNV";
      break;
    case BuiltInObjectRayOriginKHR:
      pcVar4 = "gl_ObjectRayOriginEXT";
      pcVar6 = "gl_ObjectRayOriginNV";
      break;
    case BuiltInObjectRayDirectionKHR:
      pcVar4 = "gl_ObjectRayDirectionEXT";
      pcVar6 = "gl_ObjectRayDirectionNV";
      break;
    case BuiltInRayTminKHR:
      pcVar4 = "gl_RayTminEXT";
      pcVar6 = "gl_RayTminNV";
      break;
    case BuiltInRayTmaxKHR:
      pcVar4 = "gl_RayTmaxEXT";
      pcVar6 = "gl_RayTmaxNV";
      break;
    case BuiltInInstanceCustomIndexKHR:
      pcVar4 = "gl_InstanceCustomIndexEXT";
      pcVar6 = "gl_InstanceCustomIndexNV";
      break;
    case 0x14d0:
    case 0x14d1:
    case BuiltInCurrentRayTimeNV:
    case BuiltInHitTriangleVertexPositionsKHR:
    case 0x14d8:
    case BuiltInHitMicroTriangleVertexPositionsNV:
    case 0x14da:
    case 0x14db:
    case 0x14dc:
    case 0x14dd:
    case 0x14de:
    case 0x14df:
    case BuiltInHitMicroTriangleVertexBarycentricsNV:
    case BuiltInHitMicroTriangleVertexBarycentricsNV|BuiltInPointSize:
    case 0x14e2:
    case BuiltInHitMicroTriangleVertexBarycentricsNV|BuiltInClipDistance:
    case BuiltInHitMicroTriangleVertexBarycentricsNV|BuiltInCullDistance:
    case BuiltInHitMicroTriangleVertexBarycentricsNV|BuiltInVertexId:
    case BuiltInHitMicroTriangleVertexBarycentricsNV|BuiltInInstanceId:
      goto switchD_0029e693_caseD_1145;
    case BuiltInObjectToWorldKHR:
      pcVar4 = "gl_ObjectToWorldEXT";
      pcVar6 = "gl_ObjectToWorldNV";
      break;
    case BuiltInWorldToObjectKHR:
      pcVar4 = "gl_WorldToObjectEXT";
      pcVar6 = "gl_WorldToObjectNV";
      break;
    case BuiltInHitTNV:
      pcVar6 = "gl_HitTNV";
      goto LAB_0029e8f1;
    case BuiltInHitKindKHR:
      pcVar4 = "gl_HitKindEXT";
      pcVar6 = "gl_HitKindNV";
      break;
    case BuiltInIncomingRayFlagsKHR:
      pcVar4 = "gl_IncomingRayFlagsEXT";
      pcVar6 = "gl_IncomingRayFlagsNV";
      break;
    default:
      ts_1 = &switchD_0029e693::switchdataD_0034660c;
      switch(builtin) {
      case BuiltInSubgroupEqMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar6 = "gl_SubgroupEqMask";
        break;
      case BuiltInSubgroupGeMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar6 = "gl_SubgroupGeMask";
        break;
      case BuiltInSubgroupGtMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar6 = "gl_SubgroupGtMask";
        break;
      case BuiltInSubgroupLeMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar6 = "gl_SubgroupLeMask";
        break;
      case BuiltInSubgroupLtMask:
        request_subgroup_feature(this,SubgroupMask);
        pcVar6 = "gl_SubgroupLtMask";
        break;
      case BuiltInSubgroupLtMask|BuiltInPointSize:
      case 0x1146:
      case BuiltInSubgroupLtMask|BuiltInClipDistance:
      case BuiltInDrawIndex|BuiltInPointSize:
      case BaseVertex|BuiltInCullDistance:
      case BaseVertex|BuiltInVertexId:
      case BaseVertex|BuiltInInstanceId:
      case BaseVertex|BuiltInPrimitiveId:
      case BuiltInPrimitiveShadingRateKHR|BuiltInPointSize:
      case 0x1152:
      case BuiltInPrimitiveShadingRateKHR|BuiltInClipDistance:
      case BuiltInPrimitiveShadingRateKHR|BuiltInCullDistance:
      case BuiltInPrimitiveShadingRateKHR|BuiltInVertexId:
      case BuiltInDeviceIndex|BuiltInPointSize:
      case BuiltInViewIndex|BuiltInPointSize:
      case 0x115a:
      case BuiltInViewIndex|BuiltInClipDistance:
        goto switchD_0029e693_caseD_1145;
      case BaseVertex:
        if ((this->options).es == true) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"BaseVertex not supported in ES profile.");
          goto LAB_0029f560;
        }
        if ((this->options).vulkan_semantics == true) {
          if ((this->options).version < 0x1cc) {
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar6 = "gl_BaseVertexARB";
          }
          else {
            pcVar6 = "gl_BaseVertex";
          }
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
          ::std::__cxx11::string::~string((string *)&local_38);
          pcVar6 = "SPIRV_Cross_BaseVertex";
        }
        break;
      case BaseInstance:
        if ((this->options).es == true) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"BaseInstance not supported in ES profile.");
          goto LAB_0029f560;
        }
        if ((this->options).vulkan_semantics == true) {
          if ((this->options).version < 0x1cc) {
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar6 = "gl_BaseInstanceARB";
          }
          else {
            pcVar6 = "gl_BaseInstance";
          }
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
          ::std::__cxx11::string::~string((string *)&local_38);
          pcVar6 = "SPIRV_Cross_BaseInstance";
        }
        break;
      case BuiltInDrawIndex:
        if ((this->options).es == true) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"DrawIndex not supported in ES profile.");
          goto LAB_0029f560;
        }
        if ((this->options).vulkan_semantics == true) {
          if (0x1cb < (this->options).version) {
            pcVar6 = "gl_DrawID";
            break;
          }
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_38,"GL_ARB_shader_draw_parameters",&local_39);
          require_extension_internal(this,&local_38);
        }
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar6 = "gl_DrawIDARB";
        break;
      case BuiltInPrimitiveShadingRateKHR:
        if ((this->options).vulkan_semantics == false) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,"Can only use PrimitiveShadingRateKHR in Vulkan GLSL.");
          goto LAB_0029f560;
        }
        ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_fragment_shading_rate",&local_39)
        ;
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar6 = "gl_PrimitiveShadingRateEXT";
        break;
      case BuiltInDeviceIndex:
        if ((this->options).vulkan_semantics == false) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"Need Vulkan semantics for device group support.");
          goto LAB_0029f560;
        }
        ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_device_group",&local_39);
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar6 = "gl_DeviceIndex";
        break;
      case BuiltInViewIndex:
        if ((this->options).vulkan_semantics == true) {
          pcVar6 = "gl_ViewIndex";
        }
        else {
          pcVar6 = "gl_ViewID_OVR";
        }
        break;
      case BuiltInShadingRateKHR:
        if ((this->options).vulkan_semantics == false) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"Can only use ShadingRateKHR in Vulkan GLSL.");
          goto LAB_0029f560;
        }
        ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_fragment_shading_rate",&local_39)
        ;
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
        pcVar6 = "gl_ShadingRateEXT";
        break;
      default:
        ts_1 = &switchD_0029e70b::switchdataD_00346680;
        switch(builtin) {
        case BaryCoordKHR:
          bVar2 = (this->options).es;
          uVar1 = (this->options).version;
          if ((uVar1 < 0x140 & bVar2) == 1) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"gl_BaryCoordEXT requires ESSL 320.");
          }
          else {
            if (bVar2 != false || 0x1c1 < uVar1) {
              if (this->barycentric_is_nv == true) {
                ::std::__cxx11::string::string
                          ((string *)&local_38,"GL_NV_fragment_shader_barycentric",&local_39);
                require_extension_internal(this,&local_38);
                ::std::__cxx11::string::~string((string *)&local_38);
                pcVar6 = "gl_BaryCoordNV";
              }
              else {
                ::std::__cxx11::string::string
                          ((string *)&local_38,"GL_EXT_fragment_shader_barycentric",&local_39);
                require_extension_internal(this,&local_38);
                ::std::__cxx11::string::~string((string *)&local_38);
                pcVar6 = "gl_BaryCoordEXT";
              }
              break;
            }
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"gl_BaryCoordEXT requires GLSL 450.");
          }
          goto LAB_0029f560;
        case BaryCoordNoPerspKHR:
          bVar2 = (this->options).es;
          uVar1 = (this->options).version;
          if ((uVar1 < 0x140 & bVar2) == 1) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"gl_BaryCoordNoPerspEXT requires ESSL 320.");
          }
          else {
            if (bVar2 != false || 0x1c1 < uVar1) {
              if (this->barycentric_is_nv == true) {
                ::std::__cxx11::string::string
                          ((string *)&local_38,"GL_NV_fragment_shader_barycentric",&local_39);
                require_extension_internal(this,&local_38);
                ::std::__cxx11::string::~string((string *)&local_38);
                pcVar6 = "gl_BaryCoordNoPerspNV";
              }
              else {
                ::std::__cxx11::string::string
                          ((string *)&local_38,"GL_EXT_fragment_shader_barycentric",&local_39);
                require_extension_internal(this,&local_38);
                ::std::__cxx11::string::~string((string *)&local_38);
                pcVar6 = "gl_BaryCoordNoPerspEXT";
              }
              break;
            }
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"gl_BaryCoordNoPerspEXT requires GLSL 450.");
          }
LAB_0029f560:
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        case BuiltInMeshViewCountNV|BuiltInInvocationId:
        case BuiltInMeshViewCountNV|BuiltInLayer:
        case BuiltInMeshViewCountNV|BuiltInViewportIndex:
        case BuiltInMeshViewCountNV|BuiltInTessLevelOuter:
        case BuiltInFragSizeEXT:
        case BuiltInFragInvocationCountEXT:
        case BuiltInPrimitiveTriangleIndicesEXT|BuiltInPointSize:
        case 0x14b2:
          goto switchD_0029e693_caseD_1145;
        case BuiltInPrimitivePointIndicesEXT:
          pcVar6 = "gl_PrimitivePointIndicesEXT";
          break;
        case BuiltInPrimitiveLineIndicesEXT:
          pcVar6 = "gl_PrimitiveLineIndicesEXT";
          break;
        case BuiltInPrimitiveTriangleIndicesEXT:
          pcVar6 = "gl_PrimitiveTriangleIndicesEXT";
          break;
        case BuiltInCullPrimitiveEXT:
          pcVar6 = "gl_CullPrimitiveEXT";
          break;
        default:
          if (builtin == BuiltInFragStencilRefEXT) {
            if ((this->options).es != false) {
              this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(this_00,"Stencil export not supported in GLES.");
              goto LAB_0029f560;
            }
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_ARB_shader_stencil_export",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar6 = "gl_FragStencilRefARB";
          }
          else {
            ts_1 = (uint *)CONCAT44(in_register_0000000c,storage);
            if (builtin != BuiltInFullyCoveredEXT) goto switchD_0029e693_caseD_1145;
            if ((this->options).es != false) {
              this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (this_00,"Need desktop GL to use GL_NV_conservative_raster_underestimation."
                        );
              goto LAB_0029f560;
            }
            ::std::__cxx11::string::string
                      ((string *)&local_38,"GL_NV_conservative_raster_underestimation",&local_39);
            require_extension_internal(this,&local_38);
            ::std::__cxx11::string::~string((string *)&local_38);
            pcVar6 = "gl_FragFullyCoveredNV";
          }
        }
      }
      goto LAB_0029e8f1;
    }
    if (this->ray_tracing_is_khr != false) {
      pcVar6 = pcVar4;
    }
  }
LAB_0029e8f1:
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar6,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::builtin_to_glsl(BuiltIn builtin, StorageClass storage)
{
	switch (builtin)
	{
	case BuiltInPosition:
		return "gl_Position";
	case BuiltInPointSize:
		return "gl_PointSize";
	case BuiltInClipDistance:
	{
		if (options.es)
			require_extension_internal("GL_EXT_clip_cull_distance");
		return "gl_ClipDistance";
	}
	case BuiltInCullDistance:
	{
		if (options.es)
			require_extension_internal("GL_EXT_clip_cull_distance");
		return "gl_CullDistance";
	}
	case BuiltInVertexId:
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot implement gl_VertexID in Vulkan GLSL. This shader was created "
			                  "with GL semantics.");
		return "gl_VertexID";
	case BuiltInInstanceId:
		if (options.vulkan_semantics)
		{
			auto model = get_entry_point().model;
			switch (model)
			{
			case spv::ExecutionModelIntersectionKHR:
			case spv::ExecutionModelAnyHitKHR:
			case spv::ExecutionModelClosestHitKHR:
				// gl_InstanceID is allowed in these shaders.
				break;

			default:
				SPIRV_CROSS_THROW("Cannot implement gl_InstanceID in Vulkan GLSL. This shader was "
				                  "created with GL semantics.");
			}
		}
		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}
		return "gl_InstanceID";
	case BuiltInVertexIndex:
		if (options.vulkan_semantics)
			return "gl_VertexIndex";
		else
			return "gl_VertexID"; // gl_VertexID already has the base offset applied.
	case BuiltInInstanceIndex:
		if (options.vulkan_semantics)
			return "gl_InstanceIndex";

		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}

		if (options.vertex.support_nonzero_base_instance)
		{
			if (!options.vulkan_semantics)
			{
				// This is a soft-enable. We will opt-in to using gl_BaseInstanceARB if supported.
				require_extension_internal("GL_ARB_shader_draw_parameters");
			}
			return "(gl_InstanceID + SPIRV_Cross_BaseInstance)"; // ... but not gl_InstanceID.
		}
		else
			return "gl_InstanceID";
	case BuiltInPrimitiveId:
		if (storage == StorageClassInput && get_entry_point().model == ExecutionModelGeometry)
			return "gl_PrimitiveIDIn";
		else
			return "gl_PrimitiveID";
	case BuiltInInvocationId:
		return "gl_InvocationID";
	case BuiltInLayer:
	{
		auto model = get_execution_model();
		if (model == ExecutionModelVertex || model == ExecutionModelTessellationEvaluation)
		{
			if (options.es)
				require_extension_internal("GL_NV_viewport_array2");
			else
				require_extension_internal("GL_ARB_shader_viewport_layer_array");
		}
		return "gl_Layer";
	}
	case BuiltInViewportIndex:
		return "gl_ViewportIndex";
	case BuiltInTessLevelOuter:
		return "gl_TessLevelOuter";
	case BuiltInTessLevelInner:
		return "gl_TessLevelInner";
	case BuiltInTessCoord:
		return "gl_TessCoord";
	case BuiltInPatchVertices:
		return "gl_PatchVerticesIn";
	case BuiltInFragCoord:
		return "gl_FragCoord";
	case BuiltInPointCoord:
		return "gl_PointCoord";
	case BuiltInFrontFacing:
		return "gl_FrontFacing";
	case BuiltInFragDepth:
		return "gl_FragDepth";
	case BuiltInNumWorkgroups:
		return "gl_NumWorkGroups";
	case BuiltInWorkgroupSize:
		return "gl_WorkGroupSize";
	case BuiltInWorkgroupId:
		return "gl_WorkGroupID";
	case BuiltInLocalInvocationId:
		return "gl_LocalInvocationID";
	case BuiltInGlobalInvocationId:
		return "gl_GlobalInvocationID";
	case BuiltInLocalInvocationIndex:
		return "gl_LocalInvocationIndex";
	case BuiltInHelperInvocation:
		return "gl_HelperInvocation";

	case BuiltInBaseVertex:
		if (options.es)
			SPIRV_CROSS_THROW("BaseVertex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseVertexARB";
			}
			return "gl_BaseVertex";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseVertex";

	case BuiltInBaseInstance:
		if (options.es)
			SPIRV_CROSS_THROW("BaseInstance not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseInstanceARB";
			}
			return "gl_BaseInstance";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "SPIRV_Cross_BaseInstance";

	case BuiltInDrawIndex:
		if (options.es)
			SPIRV_CROSS_THROW("DrawIndex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_DrawIDARB";
			}
			return "gl_DrawID";
		}
		// On regular GL, this is soft-enabled and we emit ifdefs in code.
		require_extension_internal("GL_ARB_shader_draw_parameters");
		return "gl_DrawIDARB";

	case BuiltInSampleId:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");
		return "gl_SampleID";

	case BuiltInSampleMask:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");

		if (storage == StorageClassInput)
			return "gl_SampleMaskIn";
		else
			return "gl_SampleMask";

	case BuiltInSamplePosition:
		if (is_legacy())
			SPIRV_CROSS_THROW("Sample variables not supported in legacy GLSL.");
		else if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		else if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_sample_shading");
		return "gl_SamplePosition";

	case BuiltInViewIndex:
		if (options.vulkan_semantics)
			return "gl_ViewIndex";
		else
			return "gl_ViewID_OVR";

	case BuiltInNumSubgroups:
		request_subgroup_feature(ShaderSubgroupSupportHelper::NumSubgroups);
		return "gl_NumSubgroups";

	case BuiltInSubgroupId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupID);
		return "gl_SubgroupID";

	case BuiltInSubgroupSize:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupSize);
		return "gl_SubgroupSize";

	case BuiltInSubgroupLocalInvocationId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInvocationID);
		return "gl_SubgroupInvocationID";

	case BuiltInSubgroupEqMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupEqMask";

	case BuiltInSubgroupGeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGeMask";

	case BuiltInSubgroupGtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGtMask";

	case BuiltInSubgroupLeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLeMask";

	case BuiltInSubgroupLtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLtMask";

	case BuiltInLaunchIdKHR:
		return ray_tracing_is_khr ? "gl_LaunchIDEXT" : "gl_LaunchIDNV";
	case BuiltInLaunchSizeKHR:
		return ray_tracing_is_khr ? "gl_LaunchSizeEXT" : "gl_LaunchSizeNV";
	case BuiltInWorldRayOriginKHR:
		return ray_tracing_is_khr ? "gl_WorldRayOriginEXT" : "gl_WorldRayOriginNV";
	case BuiltInWorldRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_WorldRayDirectionEXT" : "gl_WorldRayDirectionNV";
	case BuiltInObjectRayOriginKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayOriginEXT" : "gl_ObjectRayOriginNV";
	case BuiltInObjectRayDirectionKHR:
		return ray_tracing_is_khr ? "gl_ObjectRayDirectionEXT" : "gl_ObjectRayDirectionNV";
	case BuiltInRayTminKHR:
		return ray_tracing_is_khr ? "gl_RayTminEXT" : "gl_RayTminNV";
	case BuiltInRayTmaxKHR:
		return ray_tracing_is_khr ? "gl_RayTmaxEXT" : "gl_RayTmaxNV";
	case BuiltInInstanceCustomIndexKHR:
		return ray_tracing_is_khr ? "gl_InstanceCustomIndexEXT" : "gl_InstanceCustomIndexNV";
	case BuiltInObjectToWorldKHR:
		return ray_tracing_is_khr ? "gl_ObjectToWorldEXT" : "gl_ObjectToWorldNV";
	case BuiltInWorldToObjectKHR:
		return ray_tracing_is_khr ? "gl_WorldToObjectEXT" : "gl_WorldToObjectNV";
	case BuiltInHitTNV:
		// gl_HitTEXT is an alias of RayTMax in KHR.
		return "gl_HitTNV";
	case BuiltInHitKindKHR:
		return ray_tracing_is_khr ? "gl_HitKindEXT" : "gl_HitKindNV";
	case BuiltInIncomingRayFlagsKHR:
		return ray_tracing_is_khr ? "gl_IncomingRayFlagsEXT" : "gl_IncomingRayFlagsNV";

	case BuiltInBaryCoordKHR:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordEXT";
		}
	}

	case BuiltInBaryCoordNoPerspNV:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspNV";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			return "gl_BaryCoordNoPerspEXT";
		}
	}

	case BuiltInFragStencilRefEXT:
	{
		if (!options.es)
		{
			require_extension_internal("GL_ARB_shader_stencil_export");
			return "gl_FragStencilRefARB";
		}
		else
			SPIRV_CROSS_THROW("Stencil export not supported in GLES.");
	}

	case BuiltInPrimitiveShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use PrimitiveShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_PrimitiveShadingRateEXT";
	}

	case BuiltInShadingRateKHR:
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Can only use ShadingRateKHR in Vulkan GLSL.");
		require_extension_internal("GL_EXT_fragment_shading_rate");
		return "gl_ShadingRateEXT";
	}

	case BuiltInDeviceIndex:
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Need Vulkan semantics for device group support.");
		require_extension_internal("GL_EXT_device_group");
		return "gl_DeviceIndex";

	case BuiltInFullyCoveredEXT:
		if (!options.es)
			require_extension_internal("GL_NV_conservative_raster_underestimation");
		else
			SPIRV_CROSS_THROW("Need desktop GL to use GL_NV_conservative_raster_underestimation.");
		return "gl_FragFullyCoveredNV";

	case BuiltInPrimitiveTriangleIndicesEXT:
		return "gl_PrimitiveTriangleIndicesEXT";
	case BuiltInPrimitiveLineIndicesEXT:
		return "gl_PrimitiveLineIndicesEXT";
	case BuiltInPrimitivePointIndicesEXT:
		return "gl_PrimitivePointIndicesEXT";
	case BuiltInCullPrimitiveEXT:
		return "gl_CullPrimitiveEXT";

	default:
		return join("gl_BuiltIn_", convert_to_string(builtin));
	}
}